

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSRational.hpp
# Opt level: O0

double __thiscall
gte::BSRational<gte::UIntegerFP32<50>>::Convert<unsigned_long,double>
          (BSRational<gte::UIntegerFP32<50>> *this)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  UIntegerFP32<50> *pUVar6;
  BSRational<gte::UIntegerFP32<50>_> *local_7e0;
  double converted;
  BSNumber<gte::UIntegerFP32<50>_> result;
  int32_t trailing;
  BSNumber<gte::UIntegerFP32<50>_> local_624;
  BSNumber<gte::UIntegerFP32<50>_> local_54c;
  BSNumber<gte::UIntegerFP32<50>_> local_474;
  int local_39c;
  ulong uStack_398;
  int i;
  unsigned_long mask;
  unsigned_long w;
  undefined1 local_380 [4];
  int imax;
  BSNumber<gte::UIntegerFP32<50>_> two;
  BSNumber<gte::UIntegerFP32<50>_> one;
  int32_t pmq;
  int32_t sign;
  BSNumber<gte::UIntegerFP32<50>_> d;
  BSNumber<gte::UIntegerFP32<50>_> n;
  BSRational<gte::UIntegerFP32<50>_> *this_local;
  
  if (*(int *)this == 0) {
    this_local = (BSRational<gte::UIntegerFP32<50>_> *)0x0;
  }
  else {
    BSNumber<gte::UIntegerFP32<50>_>::BSNumber
              ((BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30),
               (BSNumber<gte::UIntegerFP32<50>_> *)this);
    BSNumber<gte::UIntegerFP32<50>_>::BSNumber
              ((BSNumber<gte::UIntegerFP32<50>_> *)&pmq,
               (BSNumber<gte::UIntegerFP32<50>_> *)(this + 0xd8));
    iVar2 = d.mUInteger.mBits._M_elems[0x30] * pmq;
    d.mUInteger.mBits._M_elems[0x30] = 1;
    pmq = 1;
    iVar3 = BSNumber<gte::UIntegerFP32<50>_>::GetExponent
                      ((BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30));
    iVar4 = BSNumber<gte::UIntegerFP32<50>_>::GetExponent((BSNumber<gte::UIntegerFP32<50>_> *)&pmq);
    one.mUInteger.mBits._M_elems[0x30] = iVar3 - iVar4;
    pUVar6 = BSNumber<gte::UIntegerFP32<50>_>::GetUInteger
                       ((BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30));
    iVar3 = UIntegerFP32<50>::GetNumBits(pUVar6);
    d.mUInteger.mBits._M_elems[0x31] = 1 - iVar3;
    pUVar6 = BSNumber<gte::UIntegerFP32<50>_>::GetUInteger((BSNumber<gte::UIntegerFP32<50>_> *)&pmq)
    ;
    iVar3 = UIntegerFP32<50>::GetNumBits(pUVar6);
    sign = 1 - iVar3;
    bVar1 = BSNumber<gte::UIntegerFP32<50>_>::LessThanIgnoreSign
                      ((BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30),
                       (BSNumber<gte::UIntegerFP32<50>_> *)&pmq);
    if (bVar1) {
      d.mUInteger.mBits._M_elems[0x31] = d.mUInteger.mBits._M_elems[0x31] + 1;
      one.mUInteger.mBits._M_elems[0x30] = one.mUInteger.mBits._M_elems[0x30] - 1;
    }
    BSNumber<gte::UIntegerFP32<50>_>::BSNumber
              ((BSNumber<gte::UIntegerFP32<50>_> *)(two.mUInteger.mBits._M_elems + 0x30),1);
    BSNumber<gte::UIntegerFP32<50>_>::BSNumber((BSNumber<gte::UIntegerFP32<50>_> *)local_380,2);
    w._4_4_ = 0x34;
    mask = 0;
    uStack_398 = 0x10000000000000;
    for (local_39c = 0x34; -1 < local_39c; local_39c = local_39c + -1) {
      bVar1 = BSNumber<gte::UIntegerFP32<50>_>::LessThanIgnoreSign
                        ((BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30),
                         (BSNumber<gte::UIntegerFP32<50>_> *)&pmq);
      if (bVar1) {
        BSNumber<gte::UIntegerFP32<50>_>::operator*
                  (&local_474,(BSNumber<gte::UIntegerFP32<50>_> *)local_380,
                   (BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30));
        BSNumber<gte::UIntegerFP32<50>_>::operator=
                  ((BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30),
                   &local_474);
      }
      else {
        BSNumber<gte::UIntegerFP32<50>_>::operator-
                  (&local_624,
                   (BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30),
                   (BSNumber<gte::UIntegerFP32<50>_> *)&pmq);
        BSNumber<gte::UIntegerFP32<50>_>::operator*
                  (&local_54c,(BSNumber<gte::UIntegerFP32<50>_> *)local_380,&local_624);
        BSNumber<gte::UIntegerFP32<50>_>::operator=
                  ((BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30),
                   &local_54c);
        mask = uStack_398 | mask;
      }
      uStack_398 = uStack_398 >> 1;
    }
    BSNumber<gte::UIntegerFP32<50>_>::operator-
              ((BSNumber<gte::UIntegerFP32<50>_> *)(result.mUInteger.mBits._M_elems + 0x31),
               (BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30),
               (BSNumber<gte::UIntegerFP32<50>_> *)&pmq);
    BSNumber<gte::UIntegerFP32<50>_>::operator=
              ((BSNumber<gte::UIntegerFP32<50>_> *)(d.mUInteger.mBits._M_elems + 0x30),
               (BSNumber<gte::UIntegerFP32<50>_> *)(result.mUInteger.mBits._M_elems + 0x31));
    if ((0 < (int)d.mUInteger.mBits._M_elems[0x30]) ||
       ((d.mUInteger.mBits._M_elems[0x30] == 0 && ((mask & 1) == 1)))) {
      mask = mask + 1;
    }
    if (mask == 0) {
      this_local = (BSRational<gte::UIntegerFP32<50>_> *)0x0;
    }
    else {
      result.mUInteger.mBits._M_elems[0x30] = BitHacks::GetTrailingBit(mask);
      mask = mask >> ((byte)result.mUInteger.mBits._M_elems[0x30] & 0x3f);
      iVar5 = result.mUInteger.mBits._M_elems[0x30] + one.mUInteger.mBits._M_elems[0x30];
      BSNumber<gte::UIntegerFP32<50>_>::BSNumber
                ((BSNumber<gte::UIntegerFP32<50>_> *)&converted,mask);
      converted._4_4_ = iVar5 + -0x34;
      local_7e0 = (BSRational<gte::UIntegerFP32<50>_> *)
                  BSNumber::operator_cast_to_double((BSNumber *)&converted);
      if (iVar2 < 0) {
        local_7e0 = (BSRational<gte::UIntegerFP32<50>_> *)((ulong)local_7e0 ^ 0x8000000000000000);
      }
      this_local = local_7e0;
    }
  }
  return (double)this_local;
}

Assistant:

RealType Convert() const
        {
            if (mNumerator.mSign == 0)
            {
                return (RealType)0;
            }

            // The ratio is abstractly of the form (1.u*2^p)/(1.v*2^q).
            // Convert to the form (1.u/1.v)*2^{p-q}, if 1.u >= 1.v, or to the
            // form (2*(1.u)/1.v)*2*{p-q-1}) if 1.u < 1.v.  The final form
            // n/d must be in the interval [1,2).
            BSNumber<UIntegerType> n = mNumerator, d = mDenominator;
            int32_t sign = n.mSign * d.mSign;
            n.mSign = 1;
            d.mSign = 1;
            int32_t pmq = n.GetExponent() - d.GetExponent();
            n.mBiasedExponent = 1 - n.GetUInteger().GetNumBits();
            d.mBiasedExponent = 1 - d.GetUInteger().GetNumBits();
            if (BSNumber<UIntegerType>::LessThanIgnoreSign(n, d))
            {
                ++n.mBiasedExponent;
                --pmq;
            }

            // At this time, n/d = 1.c in [1,2).  Define the sequence of bits
            // w = 1c = w_{imax} w_{imax-1} ... w_0 w_{-1} w_{-2} ... where
            // imax = precision(RealType)-1 and w_{imax} = 1.

            // Compute 'precision' bits for w, the leading bit guaranteed to
            // be 1 and occurring at index (1 << (precision-1)).
            BSNumber<UIntegerType> one(1), two(2);
            int const imax = std::numeric_limits<RealType>::digits - 1;
            UIntType w = 0;
            UIntType mask = ((UIntType)1 << imax);
            for (int i = imax; i >= 0; --i, mask >>= 1)
            {
                if (BSNumber<UIntegerType>::LessThanIgnoreSign(n, d))
                {
                    n = two * n;
                }
                else
                {
                    n = two * (n - d);
                    w |= mask;
                }
            }

            // Apply the mode round-to-nearest-ties-to-even to decide whether
            // to round down or up.  We computed w = w_{imax} ... w_0.  The
            // remainder is n/d = w_{imax+1}.w_{imax+2}... in [0,2).  Compute
            // n'/d = (n-d)/d in [-1,1).  Round-to-nearest-ties-to-even mode
            // is the following, where we need only test the sign of n'.  A
            // remainder of "half" is the case n' = 0.
            //   Round down when n' < 0 or (n' = 0 and w_0 = 0):  use w
            //   Round up when n' > 0 or (n' = 0 and w_0 == 1):  use w+1
            n = n - d;
            if (n.mSign > 0 || (n.mSign == 0 && (w & 1) == 1))
            {
                ++w;
            }

            if (w > 0)
            {
                // Ensure that the low-order bit of w is 1, which is required
                // for the BSNumber integer part.
                int32_t trailing = BitHacks::GetTrailingBit(w);
                w >>= trailing;
                pmq += trailing;

                // Compute a BSNumber with integer part w and the appropriate
                // number of bits and exponents.
                BSNumber<UIntegerType> result(w);
                result.mBiasedExponent = pmq - imax;
                RealType converted = (RealType)result;
                if (sign < 0)
                {
                    converted = -converted;
                }
                return converted;
            }
            else
            {
                return (RealType)0;
            }
        }